

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ModportPortSymbol::serializeTo(ModportPortSymbol *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  sVar1 = ast::toString(this->direction);
  ASTSerializer::write(serializer,9,"direction",sVar1._M_len);
  if (this->internalSymbol != (Symbol *)0x0) {
    sVar1._M_str = "internalSymbol";
    sVar1._M_len = 0xe;
    ASTSerializer::writeLink(serializer,sVar1,this->internalSymbol);
  }
  if (this->explicitConnection != (Expression *)0x0) {
    ASTSerializer::write(serializer,0x12,"explicitConnection",(size_t)this->explicitConnection);
    return;
  }
  return;
}

Assistant:

void ModportPortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("direction", toString(direction));
    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
    if (explicitConnection)
        serializer.write("explicitConnection", *explicitConnection);
}